

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  int iVar1;
  uint uVar2;
  u32 combinedFlags;
  int iTab_local;
  Expr *pB_local;
  Expr *pA_local;
  Parse *pParse_local;
  
  if ((pA == (Expr *)0x0) || (pB == (Expr *)0x0)) {
    pParse_local._4_4_ = 2;
    if (pB == pA) {
      pParse_local._4_4_ = 0;
    }
  }
  else if (((pParse == (Parse *)0x0) || (pA->op != 0x94)) ||
          (iVar1 = exprCompareVariable(pParse,pA,pB), iVar1 == 0)) {
    uVar2 = pA->flags | pB->flags;
    if ((uVar2 & 0x400) == 0) {
      if ((pA->op == pB->op) && (pA->op != 'G')) {
        if (((pA->op != 0xa2) && (pA->op != 0xa4)) && ((pA->u).zToken != (char *)0x0)) {
          if (pA->op == 0xa1) {
            iVar1 = sqlite3StrICmp((pA->u).zToken,(pB->u).zToken);
            if (iVar1 != 0) {
              return 2;
            }
            if (((pA->flags & 0x1000000) != 0) &&
               (iVar1 = sqlite3WindowCompare(pParse,(pA->y).pWin,(pB->y).pWin), iVar1 != 0)) {
              return 2;
            }
          }
          else {
            if (pA->op == 'r') {
              return 0;
            }
            if (pA->op == 'j') {
              iVar1 = sqlite3_stricmp((pA->u).zToken,(pB->u).zToken);
              if (iVar1 != 0) {
                return 2;
              }
            }
            else if (((pB->u).zToken != (char *)0x0) &&
                    (iVar1 = strcmp((pA->u).zToken,(pB->u).zToken), iVar1 != 0)) {
              return 2;
            }
          }
        }
        if ((pA->flags & 2) == (pB->flags & 2)) {
          if ((uVar2 & 0x4000) == 0) {
            if ((uVar2 & 0x800) != 0) {
              return 2;
            }
            if (((uVar2 & 8) == 0) &&
               (iVar1 = sqlite3ExprCompare(pParse,pA->pLeft,pB->pLeft,iTab), iVar1 != 0)) {
              return 2;
            }
            iVar1 = sqlite3ExprCompare(pParse,pA->pRight,pB->pRight,iTab);
            if (iVar1 != 0) {
              return 2;
            }
            iVar1 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
            if (iVar1 != 0) {
              return 2;
            }
            if (((pA->op != 'n') && (pA->op != 0x9f)) && ((uVar2 & 0x2000) == 0)) {
              if (pA->iColumn != pB->iColumn) {
                return 2;
              }
              if (pA->op2 != pB->op2) {
                return 2;
              }
              if ((pA->iTable != pB->iTable) && ((pA->iTable != iTab || (-1 < pB->iTable)))) {
                return 2;
              }
            }
          }
          pParse_local._4_4_ = 0;
        }
        else {
          pParse_local._4_4_ = 2;
        }
      }
      else if ((pA->op == 'j') && (iVar1 = sqlite3ExprCompare(pParse,pA->pLeft,pB,iTab), iVar1 < 2))
      {
        pParse_local._4_4_ = 1;
      }
      else if ((pB->op == 'j') && (iVar1 = sqlite3ExprCompare(pParse,pA,pB->pLeft,iTab), iVar1 < 2))
      {
        pParse_local._4_4_ = 1;
      }
      else {
        pParse_local._4_4_ = 2;
      }
    }
    else if (((pA->flags & pB->flags & 0x400) == 0) || ((pA->u).iValue != (pB->u).iValue)) {
      pParse_local._4_4_ = 2;
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(Parse *pParse, Expr *pA, Expr *pB, int iTab){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE && exprCompareVariable(pParse, pA, pB) ){
    return 0;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op || pA->op==TK_RAISE ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    return 2;
  }
  if( pA->op!=TK_COLUMN && pA->op!=TK_AGG_COLUMN && pA->u.zToken ){
    if( pA->op==TK_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
#ifndef SQLITE_OMIT_WINDOWFUNC
      /* Justification for the assert():
      ** window functions have p->op==TK_FUNCTION but aggregate functions
      ** have p->op==TK_AGG_FUNCTION.  So any comparison between an aggregate
      ** function and a window function should have failed before reaching
      ** this point.  And, it is not possible to have a window function and
      ** a scalar function with the same name and number of arguments.  So
      ** if we reach this point, either A and B both window functions or
      ** neither are a window functions. */
      assert( ExprHasProperty(pA,EP_WinFunc)==ExprHasProperty(pB,EP_WinFunc) );
      if( ExprHasProperty(pA,EP_WinFunc) ){
        if( sqlite3WindowCompare(pParse,pA->y.pWin,pB->y.pWin)!=0 ) return 2;
      }
#endif
    }else if( pA->op==TK_NULL ){
      return 0;
    }else if( pA->op==TK_COLLATE ){
      if( sqlite3_stricmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else if( ALWAYS(pB->u.zToken!=0) && strcmp(pA->u.zToken,pB->u.zToken)!=0 ){
      return 2;
    }
  }
  if( (pA->flags & EP_Distinct)!=(pB->flags & EP_Distinct) ) return 2;
  if( (combinedFlags & EP_TokenOnly)==0 ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( (combinedFlags & EP_FixedCol)==0
     && sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( pA->op!=TK_STRING
     && pA->op!=TK_TRUEFALSE
     && (combinedFlags & EP_Reduced)==0
    ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->op2!=pB->op2 ) return 2;
      if( pA->iTable!=pB->iTable 
       && (pA->iTable!=iTab || NEVER(pB->iTable>=0)) ) return 2;
    }
  }
  return 0;
}